

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepFaceField.h
# Opt level: O0

void anurbs::BrepFaceField<5l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  char *name_00;
  class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>> *pcVar1;
  arg aVar2;
  undefined1 local_110;
  arg local_108;
  code *local_f8;
  undefined8 local_f0;
  arg local_e8;
  arg local_d8;
  arg local_c8;
  arg local_b8;
  code *local_a8;
  undefined8 local_a0;
  code *local_98;
  undefined8 local_90;
  code *local_88;
  undefined8 local_80;
  arg local_78;
  arg local_68;
  constructor<anurbs::Ref<anurbs::BrepFace>_> local_55 [13];
  handle local_48;
  class_<anurbs::BrepFaceField<5L>,_std::shared_ptr<anurbs::BrepFaceField<5L>_>_> local_40;
  string local_38 [8];
  string name;
  class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model_local;
  module *m_local;
  
  name.field_2._8_8_ = model;
  python_name_abi_cxx11_();
  local_48.m_ptr = (m->super_object).super_handle.m_ptr;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::class_<anurbs::BrepFaceField<5L>,_std::shared_ptr<anurbs::BrepFaceField<5L>_>_>::
  class_<>(&local_40,local_48,name_00);
  pybind11::init<anurbs::Ref<anurbs::BrepFace>>();
  local_78 = pybind11::literals::operator____a("face",4);
  local_68.name = local_78.name;
  local_68._8_1_ = local_78._8_1_;
  pcVar1 = (class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>> *)
           pybind11::class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>>::
           def<anurbs::Ref<anurbs::BrepFace>,pybind11::arg>
                     ((class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>>
                       *)&local_40,local_55,&local_68);
  local_88 = BrepFaceField<5L>::face;
  local_80 = 0;
  pcVar1 = (class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>> *)
           pybind11::class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>>::
           def_property_readonly<anurbs::Ref<anurbs::BrepFace>(anurbs::BrepFaceField<5l>::*)()const>
                     (pcVar1,"face",(offset_in_Model_to_subr *)&local_88);
  local_98 = BrepFaceField<5L>::values;
  local_90 = 0;
  pcVar1 = (class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>> *)
           pybind11::class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>>::
           def_property_readonly<std::vector<Eigen::Matrix<double,1,5,1,1,5>,std::allocator<Eigen::Matrix<double,1,5,1,1,5>>>const&(anurbs::BrepFaceField<5l>::*)()const>
                     (pcVar1,"values",(offset_in_Model_to_subr *)&local_98);
  local_a8 = BrepFaceField<5L>::set_value;
  local_a0 = 0;
  local_c8 = pybind11::literals::operator____a("index",5);
  local_b8.name = local_c8.name;
  local_b8._8_1_ = local_c8._8_1_;
  local_e8 = pybind11::literals::operator____a("value",5);
  local_d8.name = local_e8.name;
  local_d8._8_1_ = local_e8._8_1_;
  pcVar1 = (class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>> *)
           pybind11::class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>>::
           def<void(anurbs::BrepFaceField<5l>::*)(long,Eigen::Matrix<double,1,5,1,1,5>const&),pybind11::arg,pybind11::arg>
                     (pcVar1,"set_value",(offset_in_Model_to_subr *)&local_a8,&local_b8,&local_d8);
  local_f8 = BrepFaceField<5L>::value;
  local_f0 = 0;
  aVar2 = pybind11::literals::operator____a("index",5);
  local_108.name = aVar2.name;
  local_110 = aVar2._8_1_;
  local_108._8_1_ = local_110;
  pybind11::class_<anurbs::BrepFaceField<5l>,std::shared_ptr<anurbs::BrepFaceField<5l>>>::
  def<Eigen::Matrix<double,1,5,1,1,5>(anurbs::BrepFaceField<5l>::*)(long)const,pybind11::arg>
            (pcVar1,"value",(offset_in_Model_to_subr *)&local_f8,&local_108);
  pybind11::class_<anurbs::BrepFaceField<5L>,_std::shared_ptr<anurbs::BrepFaceField<5L>_>_>::~class_
            (&local_40);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = BrepFaceField<TDimension>;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            // constructors
            .def(py::init<Ref<BrepFace>>(), "face"_a)
            // read-only properties
            .def_property_readonly("face", &Type::face)
            .def_property_readonly("values", &Type::values)
            // methods
            .def("set_value", &Type::set_value, "index"_a, "value"_a)
            .def("value", &Type::value, "index"_a)
        ;
    }